

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-cmp.c
# Opt level: O0

int rtosc_arg_vals_eq(rtosc_arg_val_t *lhs,rtosc_arg_val_t *rhs,size_t lsize,size_t rsize,
                     rtosc_cmp_options *opt)

{
  uint uVar1;
  int iVar2;
  rtosc_arg_val_t *in_RSI;
  rtosc_arg_val_t *in_RDI;
  int rval;
  rtosc_arg_val_itr ritr;
  rtosc_arg_val_itr litr;
  rtosc_arg_val_t rrhs;
  rtosc_arg_val_t rlhs;
  rtosc_arg_val_t *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  rtosc_arg_val_itr *in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff70;
  int iVar3;
  rtosc_arg_val_itr local_88;
  rtosc_cmp_options *in_stack_ffffffffffffffa0;
  rtosc_arg_val_t *in_stack_ffffffffffffffa8;
  rtosc_arg_val_t *in_stack_ffffffffffffffb0;
  
  rtosc_arg_val_itr_init((rtosc_arg_val_itr *)&stack0xffffffffffffff90,in_RDI);
  rtosc_arg_val_itr_init(&local_88,in_RSI);
  iVar3 = 1;
  while( true ) {
    iVar2 = rtosc_arg_vals_cmp_has_next
                      ((rtosc_arg_val_itr *)CONCAT44(iVar3,in_stack_ffffffffffffff70),
                       in_stack_ffffffffffffff68,
                       CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                       (size_t)in_stack_ffffffffffffff58);
    uVar1 = in_stack_ffffffffffffff70 & 0xffffff;
    if (iVar2 != 0) {
      uVar1 = CONCAT13(iVar3 != 0,(int3)in_stack_ffffffffffffff70);
    }
    in_stack_ffffffffffffff70 = uVar1;
    if ((char)(in_stack_ffffffffffffff70 >> 0x18) == '\0') break;
    in_stack_ffffffffffffff68 =
         (rtosc_arg_val_itr *)
         rtosc_arg_val_itr_get
                   ((rtosc_arg_val_itr *)
                    CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                    in_stack_ffffffffffffff58);
    rtosc_arg_val_itr_get
              ((rtosc_arg_val_itr *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
    iVar3 = rtosc_arg_vals_eq_single
                      (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0
                      );
    rtosc_arg_val_itr_next
              ((rtosc_arg_val_itr *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    rtosc_arg_val_itr_next
              ((rtosc_arg_val_itr *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  }
  if (iVar3 == 0) {
    iVar3 = 0;
  }
  else {
    iVar3 = rtosc_arg_vals_eq_after_abort
                      ((rtosc_arg_val_itr *)CONCAT44(iVar3,in_stack_ffffffffffffff70),
                       in_stack_ffffffffffffff68,
                       CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                       (size_t)in_stack_ffffffffffffff58);
  }
  return iVar3;
}

Assistant:

int rtosc_arg_vals_eq(const rtosc_arg_val_t* lhs, const rtosc_arg_val_t* rhs,
                      size_t lsize, size_t rsize,
                      const rtosc_cmp_options* opt)
{
    // used if the value of lhs or rhs is range-computed:
    rtosc_arg_val_t rlhs, rrhs;

    rtosc_arg_val_itr litr, ritr;
    rtosc_arg_val_itr_init(&litr, lhs);
    rtosc_arg_val_itr_init(&ritr, rhs);

    int rval = 1;

    if(!opt)
        opt = &default_cmp_options;

    for( ; rtosc_arg_vals_cmp_has_next(&litr, &ritr, lsize, rsize) && rval;
        rtosc_arg_val_itr_next(&litr),
        rtosc_arg_val_itr_next(&ritr))
    {
        rval = rtosc_arg_vals_eq_single(rtosc_arg_val_itr_get(&litr, &rlhs),
                                        rtosc_arg_val_itr_get(&ritr, &rrhs),
                                        opt);
    }

    return rval
        ? rtosc_arg_vals_eq_after_abort(&litr, &ritr, lsize, rsize)
        : rval;
}